

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::OurCharReader::OurCharReader(OurCharReader *this,bool collectComments,OurFeatures *features)

{
  Impl *pIVar1;
  
  pIVar1 = (Impl *)operator_new(0x140);
  pIVar1->_vptr_Impl = (_func_int **)&PTR__OurImpl_00150b80;
  *(bool *)&pIVar1[1]._vptr_Impl = collectComments;
  OurReader::OurReader((OurReader *)(pIVar1 + 2),features);
  (this->super_CharReader)._impl._M_t.
  super___uniq_ptr_impl<Json::CharReader::Impl,_std::default_delete<Json::CharReader::Impl>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader::Impl_*,_std::default_delete<Json::CharReader::Impl>_>.
  super__Head_base<0UL,_Json::CharReader::Impl_*,_false>._M_head_impl = pIVar1;
  (this->super_CharReader)._vptr_CharReader = (_func_int **)&PTR__CharReader_00150b58;
  return;
}

Assistant:

OurCharReader(bool collectComments, OurFeatures const& features)
      : CharReader(
            std::unique_ptr<OurImpl>(new OurImpl(collectComments, features))) {}